

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobalGet(SharedValidator *this,Location *loc,Var *global_var)

{
  bool bVar1;
  Result RVar2;
  char *pcVar3;
  int __c;
  Var local_88;
  Enum local_3c;
  undefined1 local_38 [8];
  GlobalType global_type;
  Var *global_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  unique0x100001ca = global_var;
  Opcode::Opcode((Opcode *)&global_type.type.type_index_,GlobalGet);
  this_local._4_4_ = CheckInstr(this,(Opcode)global_type.type.type_index_,loc);
  GlobalType::GlobalType((GlobalType *)local_38);
  Var::Var(&local_88,global_var);
  local_3c = (Enum)CheckGlobalIndex(this,&local_88,(GlobalType *)local_38);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_3c);
  Var::~Var(&local_88);
  RVar2 = TypeChecker::OnGlobalGet(&this->typechecker_,(Type)local_38);
  pcVar3 = (char *)(ulong)RVar2.enum_;
  Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  bVar1 = Succeeded(this_local._4_4_);
  if ((bVar1) && ((this->in_init_expr_ & 1U) != 0)) {
    pcVar3 = Var::index(global_var,pcVar3,__c);
    if (this->num_imported_globals_ <= (uint)pcVar3) {
      RVar2 = PrintError(this,&global_var->loc,
                         "initializer expression can only reference an imported global");
      Result::operator|=((Result *)((long)&this_local + 4),RVar2);
    }
    if (((undefined1)global_type.type.enum_ & ~I64) != Any) {
      RVar2 = PrintError(this,loc,"initializer expression cannot reference a mutable global");
      Result::operator|=((Result *)((long)&this_local + 4),RVar2);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnGlobalGet(const Location& loc, Var global_var) {
  Result result = CheckInstr(Opcode::GlobalGet, loc);
  GlobalType global_type;
  result |= CheckGlobalIndex(global_var, &global_type);
  result |= typechecker_.OnGlobalGet(global_type.type);
  if (Succeeded(result) && in_init_expr_) {
    if (global_var.index() >= num_imported_globals_) {
      result |= PrintError(
          global_var.loc,
          "initializer expression can only reference an imported global");
    }
    if (global_type.mutable_) {
      result |= PrintError(
          loc, "initializer expression cannot reference a mutable global");
    }
  }

  return result;
}